

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O1

void tc(int pi)

{
  int iVar1;
  int got;
  int iVar2;
  char buf [128];
  undefined2 local_b8;
  char local_b6;
  
  printf("SPI tests.");
  iVar1 = spi_open(pi,1,50000);
  CHECK(0xc,1,iVar1,0,0,"spi open");
  iVar2 = 5;
  do {
    local_b6 = '\0';
    local_b8 = 0x8001;
    got = spi_xfer(pi,iVar1,&local_b8,&local_b8);
    CHECK(0xc,2,got,3,0,"spi xfer");
    if (got == 3) {
      time_sleep(0x3ff0000000000000);
      printf("%d ",(ulong)((int)local_b6 | (local_b8._1_1_ & 0xf) << 8));
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar1 = spi_close(pi,iVar1);
  CHECK(0xc,99,iVar1,0,0,"spi close");
  return;
}

Assistant:

void tc(int pi)
{
   int h, x, b, e;
   char buf[128];

   printf("SPI tests.");

   /* this test requires a MCP3202 on SPI channel 1 */

   h = spi_open(pi, 1, 50000, 0);
   CHECK(12, 1, h, 0, 0, "spi open");


   for (x=0; x<5; x++)
   {
      sprintf(buf, "\x01\x80");
      b = spi_xfer(pi, h, buf, buf, 3);
      CHECK(12, 2, b, 3, 0, "spi xfer");
      if (b == 3)
      {
         time_sleep(1.0);
         printf("%d ", ((buf[1]&0x0F)*256)|buf[2]);
      }
   }

   e = spi_close(pi, h);
   CHECK(12, 99, e, 0, 0, "spi close");
}